

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O3

void __thiscall
rlottie::internal::renderer::Group::addChildren(Group *this,Group *data,VArenaAlloc *allocator)

{
  pointer *pppOVar1;
  iterator __position;
  pointer ppOVar2;
  pointer ppOVar3;
  GradientStroke *local_48;
  GradientStroke *local_40;
  vector<rlottie::internal::renderer::Object*,std::allocator<rlottie::internal::renderer::Object*>>
  *local_38;
  
  if (data != (Group *)0x0) {
    ppOVar2 = (data->mChildren).
              super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppOVar3 = (data->mChildren).
              super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppOVar2 != ppOVar3) {
      std::
      vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
      ::reserve(&this->mContents,(long)ppOVar3 - (long)ppOVar2 >> 3);
      ppOVar2 = (data->mChildren).
                super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppOVar3 = (data->mChildren).
                super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    if (ppOVar3 != ppOVar2) {
      local_38 = (vector<rlottie::internal::renderer::Object*,std::allocator<rlottie::internal::renderer::Object*>>
                  *)&this->mContents;
      do {
        local_48 = (GradientStroke *)ppOVar3[-1];
        local_40 = (GradientStroke *)allocator;
        switch((((anon_union_16_2_e89eba29_for_Object_1 *)&local_48->super_Gradient)->mData)._type)
        {
        case Group:
          local_40 = (GradientStroke *)
                     VArenaAlloc::
                     make<rlottie::internal::renderer::Group,rlottie::internal::model::Group*,VArenaAlloc*&>
                               (allocator,(Group **)&local_48,(VArenaAlloc **)&local_40);
          break;
        default:
          goto switchD_001299de_caseD_4;
        case Fill:
          local_40 = (GradientStroke *)
                     VArenaAlloc::
                     make<rlottie::internal::renderer::Fill,rlottie::internal::model::Fill*>
                               (allocator,(Fill **)&local_48);
          break;
        case Stroke:
          local_40 = (GradientStroke *)
                     VArenaAlloc::
                     make<rlottie::internal::renderer::Stroke,rlottie::internal::model::Stroke*>
                               (allocator,(Stroke **)&local_48);
          break;
        case GFill:
          local_40 = (GradientStroke *)
                     VArenaAlloc::
                     make<rlottie::internal::renderer::GradientFill,rlottie::internal::model::GradientFill*>
                               (allocator,(GradientFill **)&local_48);
          break;
        case GStroke:
          local_40 = VArenaAlloc::
                     make<rlottie::internal::renderer::GradientStroke,rlottie::internal::model::GradientStroke*>
                               (allocator,&local_48);
          break;
        case Rect:
          local_40 = (GradientStroke *)
                     VArenaAlloc::
                     make<rlottie::internal::renderer::Rect,rlottie::internal::model::Rect*>
                               (allocator,(Rect **)&local_48);
          break;
        case Ellipse:
          local_40 = (GradientStroke *)
                     VArenaAlloc::
                     make<rlottie::internal::renderer::Ellipse,rlottie::internal::model::Ellipse*>
                               (allocator,(Ellipse **)&local_48);
          break;
        case Path:
          local_40 = (GradientStroke *)
                     VArenaAlloc::
                     make<rlottie::internal::renderer::Path,rlottie::internal::model::Path*>
                               (allocator,(Path **)&local_48);
          break;
        case Polystar:
          local_40 = (GradientStroke *)
                     VArenaAlloc::
                     make<rlottie::internal::renderer::Polystar,rlottie::internal::model::Polystar*>
                               (allocator,(Polystar **)&local_48);
          break;
        case Trim:
          local_40 = (GradientStroke *)
                     VArenaAlloc::
                     make<rlottie::internal::renderer::Trim,rlottie::internal::model::Trim*>
                               (allocator,(Trim **)&local_48);
          break;
        case Repeater:
          local_40 = (GradientStroke *)
                     VArenaAlloc::
                     make<rlottie::internal::renderer::Repeater,rlottie::internal::model::Repeater*,VArenaAlloc*&>
                               (allocator,(Repeater **)&local_48,(VArenaAlloc **)&local_40);
        }
        if (local_40 != (GradientStroke *)0x0) {
          __position._M_current =
               (this->mContents).
               super__Vector_base<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->mContents).
              super__Vector_base<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<rlottie::internal::renderer::Object*,std::allocator<rlottie::internal::renderer::Object*>>
            ::_M_realloc_insert<rlottie::internal::renderer::Object*const&>
                      (local_38,__position,(Object **)&local_40);
          }
          else {
            *__position._M_current = (Object *)local_40;
            pppOVar1 = &(this->mContents).
                        super__Vector_base<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppOVar1 = *pppOVar1 + 1;
          }
        }
switchD_001299de_caseD_4:
        ppOVar3 = ppOVar3 + -1;
      } while (ppOVar3 !=
               (data->mChildren).
               super__Vector_base<rlottie::internal::model::Object_*,_std::allocator<rlottie::internal::model::Object_*>_>
               ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void renderer::Group::addChildren(model::Group *data, VArenaAlloc *allocator)
{
    if (!data) return;

    if (!data->mChildren.empty()) mContents.reserve(data->mChildren.size());

    // keep the content in back-to-front order.
    // as lottie model keeps it in front-to-back order.
    for (auto it = data->mChildren.crbegin(); it != data->mChildren.rend();
         ++it) {
        auto content = createContentItem(*it, allocator);
        if (content) {
            mContents.push_back(content);
        }
    }
}